

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O2

bool __thiscall
gl4cts::GPUShaderFP64Test3::prepareUniformBuffer
          (GPUShaderFP64Test3 *this,programInfo *program_info,bool verify_offsets)

{
  ostringstream *this_00;
  uint uVar1;
  int iVar2;
  ulong uVar3;
  int iVar4;
  deUint32 dVar5;
  undefined4 extraout_var;
  MessageBuilder *this_01;
  pointer puVar7;
  ulong uVar8;
  int *piVar9;
  bool bVar10;
  int *piVar11;
  uint uVar12;
  ulong __new_size;
  double dVar13;
  vector<unsigned_char,_std::allocator<unsigned_char>_> buffer_data;
  undefined1 local_1b0 [384];
  long lVar6;
  
  __new_size = (ulong)(uint)program_info->m_buffer_size;
  iVar4 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar6 = CONCAT44(extraout_var,iVar4);
  puVar7 = (this->m_uniform_details).
           super__Vector_base<gl4cts::GPUShaderFP64Test3::uniformDetails,_std::allocator<gl4cts::GPUShaderFP64Test3::uniformDetails>_>
           ._M_impl.super__Vector_impl_data._M_start;
  piVar9 = (program_info->m_uniform_offsets).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  piVar11 = (program_info->m_uniform_matrix_strides).super__Vector_base<int,_std::allocator<int>_>.
            _M_impl.super__Vector_impl_data._M_start;
  buffer_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  buffer_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  buffer_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(&buffer_data,__new_size);
  bVar10 = true;
  uVar12 = 1;
  for (; (this->m_uniform_details).
         super__Vector_base<gl4cts::GPUShaderFP64Test3::uniformDetails,_std::allocator<gl4cts::GPUShaderFP64Test3::uniformDetails>_>
         ._M_impl.super__Vector_impl_data._M_finish != puVar7; puVar7 = puVar7 + 1) {
    iVar4 = *piVar11;
    uVar1 = puVar7->m_n_elements;
    uVar3 = (ulong)uVar1 / (ulong)puVar7->m_n_columns;
    iVar2 = *piVar9;
    dVar13 = 0.0;
    for (uVar8 = 0; uVar1 != (uint)uVar8; uVar8 = (ulong)((uint)uVar8 + 1)) {
      *(double *)
       (buffer_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start +
       (uint)((int)(uVar8 / uVar3) * iVar4 + iVar2 + (int)(uVar8 % uVar3) * 8)) =
           (this->m_base_element - dVar13) * 0.25 +
           (double)uVar12 * 13.0 + this->m_base_type_ordinal;
      dVar13 = dVar13 + 1.0;
    }
    if ((verify_offsets) && (iVar4 = puVar7->m_expected_std140_offset, iVar4 != iVar2)) {
      if (bVar10) {
        local_1b0._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1b0 + 8));
        std::operator<<((ostream *)(local_1b0 + 8),"Error");
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_1b0 + 8));
      }
      local_1b0._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1b0 + 8));
      std::operator<<((ostream *)(local_1b0 + 8),"Uniform: ");
      this_01 = tcu::MessageBuilder::operator<<((MessageBuilder *)local_1b0,&puVar7->m_name);
      this_00 = &this_01->m_str;
      std::operator<<(&this_00->super_basic_ostream<char,_std::char_traits<char>_>," has offset: ");
      std::ostream::operator<<(this_00,iVar2);
      std::operator<<(&this_00->super_basic_ostream<char,_std::char_traits<char>_>,
                      ". Expected offset: ");
      std::ostream::operator<<(this_00,iVar4);
      tcu::MessageBuilder::operator<<(this_01,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_1b0 + 8));
      bVar10 = false;
    }
    piVar9 = piVar9 + 1;
    piVar11 = piVar11 + 1;
    uVar12 = uVar12 + 1;
  }
  (**(code **)(lVar6 + 0x40))(0x8a11,this->m_uniform_buffer_id);
  dVar5 = (**(code **)(lVar6 + 0x800))();
  glu::checkError(dVar5,"BindBuffer",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                  ,0x1472);
  (**(code **)(lVar6 + 0x150))
            (0x8a11,__new_size,
             buffer_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start,0x88e4);
  dVar5 = (**(code **)(lVar6 + 0x800))();
  glu::checkError(dVar5,"BufferData",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                  ,0x1475);
  (**(code **)(lVar6 + 0x50))(0x8a11,0,this->m_uniform_buffer_id,0,__new_size);
  dVar5 = (**(code **)(lVar6 + 0x800))();
  glu::checkError(dVar5,"BindBufferRange",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                  ,0x1479);
  (**(code **)(lVar6 + 0x15d0))
            (program_info->m_program_object_id,program_info->m_uniform_block_index,0);
  dVar5 = (**(code **)(lVar6 + 0x800))();
  glu::checkError(dVar5,"UniformBlockBinding",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                  ,0x147c);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&buffer_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  return bVar10;
}

Assistant:

bool GPUShaderFP64Test3::prepareUniformBuffer(const programInfo& program_info, bool verify_offsets) const
{
	const glw::GLuint							buffer_size = program_info.m_buffer_size;
	const glw::Functions&						gl			= m_context.getRenderContext().getFunctions();
	bool										offset_verification_result = true;
	glw::GLuint									type_ordinal			   = 1;
	std::vector<uniformDetails>::const_iterator it_uniform_details		   = m_uniform_details.begin();
	std::vector<glw::GLint>::const_iterator		it_uniform_offsets		   = program_info.m_uniform_offsets.begin();
	std::vector<glw::GLint>::const_iterator it_uniform_matrix_strides = program_info.m_uniform_matrix_strides.begin();

	/* Prepare storage for uniform buffer data */
	std::vector<glw::GLubyte> buffer_data;
	buffer_data.resize(buffer_size);

	/* For each "double precision" uniform */
	for (/* start conditions already set up */; m_uniform_details.end() != it_uniform_details;
		 ++it_uniform_details, ++it_uniform_offsets, ++it_uniform_matrix_strides, ++type_ordinal)
	{
		const glw::GLint  matrix_stride  = *it_uniform_matrix_strides;
		const glw::GLuint n_columns		 = it_uniform_details->m_n_columns;
		const glw::GLuint n_elements	 = it_uniform_details->m_n_elements;
		const glw::GLuint column_length  = n_elements / n_columns;
		const glw::GLint  uniform_offset = *it_uniform_offsets;

		/* For each element of uniform */
		for (glw::GLuint element = 0; element < n_elements; ++element)
		{
			const glw::GLuint   column		= element / column_length;
			const glw::GLuint   column_elem = element % column_length;
			const glw::GLdouble value		= getExpectedValue(type_ordinal, element);
			const glw::GLuint   value_offset =
				static_cast<glw::GLuint>(uniform_offset + column * matrix_stride + column_elem * sizeof(glw::GLdouble));

			glw::GLdouble* value_dst = (glw::GLdouble*)&buffer_data[value_offset];

			/* Store value */
			*value_dst = value;
		}

		/* Uniform offset verification */
		if (true == verify_offsets)
		{
			const glw::GLint expected_offset = it_uniform_details->m_expected_std140_offset;

			if (expected_offset != uniform_offset)
			{
				if (true == offset_verification_result)
				{
					m_context.getTestContext().getLog() << tcu::TestLog::Message << "Error" << tcu::TestLog::EndMessage;
				}

				m_context.getTestContext().getLog()
					<< tcu::TestLog::Message << "Uniform: " << it_uniform_details->m_name
					<< " has offset: " << uniform_offset << ". Expected offset: " << expected_offset
					<< tcu::TestLog::EndMessage;

				offset_verification_result = false;
			}
		}
	}

	/* Update uniform buffer with prepared data */
	gl.bindBuffer(GL_UNIFORM_BUFFER, m_uniform_buffer_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "BindBuffer");

	gl.bufferData(GL_UNIFORM_BUFFER, buffer_size, &buffer_data[0], GL_STATIC_DRAW);
	GLU_EXPECT_NO_ERROR(gl.getError(), "BufferData");

	/* Bind uniform buffer as data source for named uniform block */
	gl.bindBufferRange(GL_UNIFORM_BUFFER, 0 /* index */, m_uniform_buffer_id, 0, buffer_size);
	GLU_EXPECT_NO_ERROR(gl.getError(), "BindBufferRange");

	gl.uniformBlockBinding(program_info.m_program_object_id, program_info.m_uniform_block_index, 0 /* binding */);
	GLU_EXPECT_NO_ERROR(gl.getError(), "UniformBlockBinding");

	/* Done */
	return offset_verification_result;
}